

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void __thiscall fasttext::DenseMatrix::addRowToVector(DenseMatrix *this,Vector *x,int32_t i,real a)

{
  undefined1 auVar1 [16];
  DenseMatrix *this_00;
  int64_t iVar2;
  Matrix *this_01;
  Matrix *pMVar3;
  real *prVar4;
  int in_EDX;
  uint in_XMM0_Da;
  int64_t j;
  real rVar5;
  uint uVar6;
  int64_t in_stack_ffffffffffffffc0;
  Vector *this_02;
  Matrix *in_stack_ffffffffffffffc8;
  Vector *local_20;
  
  if (in_EDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                  ,0x79,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const"
                 );
  }
  this_00 = (DenseMatrix *)(long)in_EDX;
  iVar2 = Matrix::size(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if ((long)this_00 < iVar2) {
    this_01 = (Matrix *)Vector::size((Vector *)0x15c75a);
    pMVar3 = (Matrix *)Matrix::size(this_01,in_stack_ffffffffffffffc0);
    if (this_01 == pMVar3) {
      local_20 = (Vector *)0x0;
      while( true ) {
        this_02 = local_20;
        iVar2 = Matrix::size(this_01,(int64_t)local_20);
        if (iVar2 <= (long)this_02) break;
        uVar6 = in_XMM0_Da;
        prVar4 = at(this_00,(int64_t)this_01,(int64_t)this_02);
        rVar5 = *prVar4;
        prVar4 = Vector::operator[](this_02,CONCAT44(uVar6,rVar5));
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)rVar5),ZEXT416(uVar6),ZEXT416((uint)*prVar4));
        *prVar4 = auVar1._0_4_;
        local_20 = (Vector *)
                   ((long)&(local_20->data_).super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1);
      }
      return;
    }
    __assert_fail("x.size() == this->size(1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                  ,0x7b,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const"
                 );
  }
  __assert_fail("i < this->size(0)",
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                ,0x7a,
                "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const")
  ;
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i, real a) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < this->size(1); j++) {
    x[j] += a * at(i, j);
  }
}